

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

GroupObject * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::GroupObject>
          (Structure *this,shared_ptr<Assimp::Blender::GroupObject> *out,size_t *s)

{
  GroupObject *__p;
  __shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __p = (GroupObject *)operator_new(0x40);
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)0x0;
  (__p->super_ElemBase).dna_type = (char *)0x0;
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__GroupObject_0075d0a0;
  (__p->prev).super___shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->prev).super___shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->next).super___shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->next).super___shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->ob).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->ob).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_ptr<Assimp::Blender::GroupObject,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::GroupObject,void>
            ((__shared_ptr<Assimp::Blender::GroupObject,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,__p
            );
  ::std::__shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::GroupObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }